

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O3

int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *pNtk)

{
  Abc_Ntk_t *pNtk_00;
  void *pvVar1;
  MinRegMan_t *pMVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  
  pMVar2 = pManMR;
  pNtk_00 = pManMR->pInitNtk;
  if (pNtk_00 == (Abc_Ntk_t *)0x0) {
    __assert_fail("pManMR->pInitNtk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x22f,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
  }
  if (pManMR->fSolutionIsDc != 0) {
    pVVar3 = pNtk->vBoxes;
    if (0 < pVVar3->nSize) {
      lVar4 = 0;
      do {
        if ((*(uint *)((long)pVVar3->pArray[lVar4] + 0x14) & 0xf) == 8) {
          *(undefined8 *)((long)pVVar3->pArray[lVar4] + 0x38) = 3;
          pVVar3 = pNtk->vBoxes;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pVVar3->nSize);
    }
    if (pMVar2->fVerbose != 0) {
      puts("\tno init state computation: all-don\'t-care solution");
    }
    return 1;
  }
  lVar4 = (long)pNtk_00->vObjs->nSize;
  if (0 < lVar4) {
    lVar5 = 0;
    do {
      pvVar1 = pNtk_00->vObjs->pArray[lVar5];
      if (pvVar1 != (void *)0x0) {
        uVar6 = *(uint *)((long)pvVar1 + 0x14) & 0xf;
        if (uVar6 == 4) {
          __assert_fail("!Abc_ObjIsBi(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                        ,0x23d,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
        }
        if (uVar6 == 5) {
          __assert_fail("!Abc_ObjIsBo(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                        ,0x23c,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
        }
        if (uVar6 == 8) {
          __assert_fail("!Abc_ObjIsLatch(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                        ,0x23b,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  Abc_NtkAddDummyPoNames(pNtk_00);
  Abc_NtkAddDummyPiNames(pManMR->pInitNtk);
  if (pManMR->pInitNtk->ntkType == ABC_NTK_LOGIC) {
    Abc_NtkCleanup(pManMR->pInitNtk,0);
  }
  if (pManMR->fVerbose != 0) {
    printf("\tsolving for init state (%d nodes)... ",(ulong)(uint)pManMR->pInitNtk->nObjs);
  }
  fflush(_stdout);
}

Assistant:

int Abc_FlowRetime_SolveBackwardInit( Abc_Ntk_t * pNtk ) {
  int i;
  Abc_Obj_t *pObj, *pInitObj;
  Vec_Ptr_t *vDelete = Vec_PtrAlloc(0);
  Abc_Ntk_t *pSatNtk;
  int result;

  assert(pManMR->pInitNtk);

  // is the solution entirely DC's?
  if (pManMR->fSolutionIsDc) {
    Vec_PtrFree(vDelete);
    Abc_NtkForEachLatch( pNtk, pObj, i ) Abc_LatchSetInitDc( pObj );
    vprintf("\tno init state computation: all-don't-care solution\n");
    return 1;
  }

  // check that network is combinational
  Abc_NtkForEachObj( pManMR->pInitNtk, pObj, i ) {
    assert(!Abc_ObjIsLatch(pObj));
    assert(!Abc_ObjIsBo(pObj));
    assert(!Abc_ObjIsBi(pObj));
  }
  
  // delete superfluous nodes
  while(Vec_PtrSize( vDelete )) {
    pObj = (Abc_Obj_t *)Vec_PtrPop( vDelete );
    Abc_NtkDeleteObj( pObj );
  }
  Vec_PtrFree(vDelete);

  // do some final cleanup on the network
  Abc_NtkAddDummyPoNames(pManMR->pInitNtk);
  Abc_NtkAddDummyPiNames(pManMR->pInitNtk);
  if (Abc_NtkIsLogic(pManMR->pInitNtk))
    Abc_NtkCleanup(pManMR->pInitNtk, 0);

#if defined(DEBUG_PRINT_INIT_NTK)
  Abc_NtkLevelReverse( pManMR->pInitNtk );
  Abc_NtkForEachObj( pManMR->pInitNtk, pObj, i ) 
    if (Abc_ObjLevel( pObj ) < 2)
      Abc_ObjPrint(stdout, pObj);
#endif
  
  vprintf("\tsolving for init state (%d nodes)... ", Abc_NtkObjNum(pManMR->pInitNtk));
  fflush(stdout);
#ifdef ABC_USE_CUDD
  // convert SOPs to BDD
  if (Abc_NtkHasSop(pManMR->pInitNtk))
    Abc_NtkSopToBdd( pManMR->pInitNtk );
  // convert AIGs to BDD
  if (Abc_NtkHasAig(pManMR->pInitNtk))
    Abc_NtkAigToBdd( pManMR->pInitNtk );
#else
  // convert SOPs to AIG
  if (Abc_NtkHasSop(pManMR->pInitNtk))
    Abc_NtkSopToAig( pManMR->pInitNtk );
#endif
  pSatNtk = pManMR->pInitNtk;
  
  // solve
  result = Abc_NtkMiterSat( pSatNtk, (ABC_INT64_T)500000, (ABC_INT64_T)50000000, 0, NULL, NULL );

  if (!result) { 
    vprintf("SUCCESS\n");
  } else  {    
    vprintf("FAILURE\n");
    return 0;
  }

  // clear initial values, associate PIs to latches
  Abc_NtkForEachPi( pManMR->pInitNtk, pInitObj, i ) Abc_ObjSetCopy( pInitObj, NULL );
  Abc_NtkForEachLatch( pNtk, pObj, i ) {
    pInitObj = (Abc_Obj_t*)Abc_ObjData( pObj );
    assert( Abc_ObjIsPi( pInitObj ));
    Abc_ObjSetCopy( pInitObj, pObj );
    Abc_LatchSetInitNone( pObj );

    // DEBUG
    // printf("solve : getting latch %d from PI %d\n", pObj->Id, pInitObj->Id);
  }

  // copy solution from PIs to latches
  assert(pManMR->pInitNtk->pModel);
  Abc_NtkForEachPi( pManMR->pInitNtk, pInitObj, i ) {
    if ((pObj = Abc_ObjCopy( pInitObj ))) {
      if ( pManMR->pInitNtk->pModel[i] )
        Abc_LatchSetInit1( pObj );
      else
        Abc_LatchSetInit0( pObj );
    }
  }

#if defined(DEBUG_CHECK)
  // check that all latches have initial state
  Abc_NtkForEachLatch( pNtk, pObj, i ) assert( !Abc_LatchIsInitNone( pObj ) );
#endif

  return 1;
}